

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O1

void cmime_header_set_value(CMimeHeader_T *header,char *value,int overwrite)

{
  size_t sVar1;
  char **ppcVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (header != (CMimeHeader_T *)0x0) {
    if (overwrite == 1) {
      if (header->count != 0) {
        uVar4 = 0;
        do {
          if (header->value[uVar4] != (char *)0x0) {
            free(header->value[uVar4]);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < header->count);
      }
      header->count = 0;
    }
    ppcVar2 = (char **)realloc(header->value,header->count * 8 + 8);
    if (value == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = strdup(value);
    }
    sVar1 = header->count;
    ppcVar2[sVar1] = pcVar3;
    header->value = ppcVar2;
    header->count = sVar1 + 1;
    return;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x44,"void cmime_header_set_value(CMimeHeader_T *, const char *, int)");
}

Assistant:

void cmime_header_set_value(CMimeHeader_T *header, const char *value, int overwrite) {
    char **tmp = NULL;
    size_t i;
    assert(header);

    if (overwrite==1) {
        for(i = 0; i < header->count; i++) {
            if (header->value[i] != NULL) 
                free(header->value[i]);
        }
        header->count = 0;
    }

    tmp = realloc(header->value, (sizeof( *tmp) * (header->count+1)));
    if (value != NULL)
        tmp[header->count] = strdup(value);
    else 
        tmp[header->count] = NULL;
    header->value = tmp;
    
    header->count++;
}